

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.hpp
# Opt level: O0

float __thiscall hnsw::L2Distance::operator()(L2Distance *this,float *p1,float *p2)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [24];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  L2Distance *in_RDI;
  float fVar15;
  uint i;
  float *ptr2;
  float *ptr1;
  float unpack [8];
  float *residual_start2;
  float *residual_start1;
  uint aligned_size;
  uint residual_size;
  __m256 tmp1;
  __m256 tmp0;
  __m256 sum;
  float result;
  uint local_3b4;
  undefined1 (*local_3b0) [32];
  undefined1 (*local_3a8) [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 (*local_378) [32];
  undefined1 (*local_370) [32];
  uint local_368;
  uint local_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_2f4;
  undefined1 (*local_2f0) [32];
  undefined1 (*local_2e8) [32];
  undefined1 (*local_2d8) [32];
  undefined1 (*local_2d0) [32];
  undefined1 (*local_2c8) [32];
  undefined1 (*local_2c0) [32];
  undefined1 (*local_2b8) [32];
  undefined1 (*local_2b0) [32];
  undefined8 *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 *local_38;
  
  (in_RDI->super_Distance).num = (in_RDI->super_Distance).num + 1;
  local_2f4 = 0.0;
  local_364 = (uint)(in_RDI->super_Distance).dim_ & 0xf;
  local_368 = (int)(in_RDI->super_Distance).dim_ - local_364;
  local_370 = (undefined1 (*) [32])(*in_RSI + (ulong)local_368 * 4);
  local_378 = (undefined1 (*) [32])(*in_RDX + (ulong)local_368 * 4);
  local_2f0 = in_RDX;
  local_2e8 = in_RSI;
  memset(&local_3a0,0,0x20);
  local_2a8 = &local_3a0;
  local_320 = local_3a0;
  uStack_318 = uStack_398;
  uStack_310 = uStack_390;
  uStack_308 = uStack_388;
  local_3a8 = local_2e8;
  local_3b0 = local_2f0;
  for (local_3b4 = 0; uVar5 = uStack_68, uVar4 = uStack_70, uVar3 = uStack_78, uVar2 = local_80,
      local_80._0_4_ = (float)local_320, uStack_78._0_4_ = (float)uStack_318,
      uStack_70._0_4_ = (float)uStack_310, uStack_68._0_4_ = (float)uStack_308,
      local_3b4 < local_368; local_3b4 = local_3b4 + 0x10) {
    local_2b0 = local_3a8;
    auVar14 = *(undefined1 (*) [24])*local_3a8;
    uStack_1e8 = *(undefined8 *)(*local_3a8 + 0x18);
    local_2b8 = local_3b0;
    local_220 = *(undefined8 *)*local_3b0;
    uStack_218 = *(undefined8 *)(*local_3b0 + 8);
    uStack_210 = *(undefined8 *)(*local_3b0 + 0x10);
    uStack_208 = *(undefined8 *)(*local_3b0 + 0x18);
    local_340 = auVar14._0_8_;
    local_200 = local_340;
    uStack_338 = auVar14._8_8_;
    uStack_1f8 = uStack_338;
    uStack_330 = auVar14._16_8_;
    uStack_1f0 = uStack_330;
    auVar1 = vsubps_avx(*local_3a8,*local_3b0);
    local_340 = auVar1._0_8_;
    uVar2 = local_340;
    uStack_338 = auVar1._8_8_;
    uVar3 = uStack_338;
    uStack_330 = auVar1._16_8_;
    uVar4 = uStack_330;
    uStack_328 = auVar1._24_8_;
    uVar5 = uStack_328;
    local_160 = local_340;
    uStack_158 = uStack_338;
    uStack_150 = uStack_330;
    uStack_148 = uStack_328;
    local_140._0_4_ = auVar1._0_4_;
    local_140._4_4_ = auVar1._4_4_;
    uStack_138._0_4_ = auVar1._8_4_;
    uStack_138._4_4_ = auVar1._12_4_;
    uStack_130._0_4_ = auVar1._16_4_;
    uStack_130._4_4_ = auVar1._20_4_;
    uStack_128._0_4_ = auVar1._24_4_;
    uStack_128._4_4_ = auVar1._28_4_;
    local_340 = CONCAT44(local_140._4_4_ * local_140._4_4_,(float)local_140 * (float)local_140);
    uStack_338._0_4_ = (float)uStack_138 * (float)uStack_138;
    uStack_338._4_4_ = uStack_138._4_4_ * uStack_138._4_4_;
    uStack_330._0_4_ = (float)uStack_130 * (float)uStack_130;
    uStack_330._4_4_ = uStack_130._4_4_ * uStack_130._4_4_;
    auVar14 = _local_340;
    uStack_328._0_4_ = (float)uStack_128 * (float)uStack_128;
    uStack_328._4_4_ = uStack_128._4_4_;
    auVar1 = _local_340;
    uVar6 = local_320;
    uVar7 = uStack_318;
    uVar8 = uStack_310;
    uVar9 = uStack_308;
    local_a0 = local_340;
    uStack_98 = uStack_338;
    uStack_330 = auVar14._16_8_;
    uStack_90 = uStack_330;
    uStack_328 = auVar1._24_8_;
    uStack_88 = uStack_328;
    local_80._0_4_ = (float)local_80 + (float)local_140 * (float)local_140;
    local_320._4_4_ = local_320._4_4_ + local_140._4_4_ * local_140._4_4_;
    uStack_78._0_4_ = (float)uStack_78 + (float)uStack_138 * (float)uStack_138;
    uStack_318._4_4_ = uStack_318._4_4_ + uStack_138._4_4_ * uStack_138._4_4_;
    uStack_70._0_4_ = (float)uStack_70 + (float)uStack_130 * (float)uStack_130;
    uStack_310._4_4_ = uStack_310._4_4_ + uStack_130._4_4_ * uStack_130._4_4_;
    uStack_68._0_4_ = (float)uStack_68 + (float)uStack_128 * (float)uStack_128;
    uStack_308._4_4_ = uStack_308._4_4_ + uStack_128._4_4_;
    local_320 = CONCAT44(local_320._4_4_,(float)local_80);
    uStack_318 = CONCAT44(uStack_318._4_4_,(float)uStack_78);
    uStack_310 = CONCAT44(uStack_310._4_4_,(float)uStack_70);
    uStack_308 = CONCAT44(uStack_308._4_4_,(float)uStack_68);
    local_2c0 = local_3a8 + 1;
    auVar14 = *(undefined1 (*) [24])*local_2c0;
    uStack_228 = *(undefined8 *)(local_3a8[1] + 0x18);
    local_2c8 = local_3b0 + 1;
    local_360 = *(undefined8 *)*local_2c8;
    uStack_358 = *(undefined8 *)(local_3b0[1] + 8);
    uStack_350 = *(undefined8 *)(local_3b0[1] + 0x10);
    uStack_348 = *(undefined8 *)(local_3b0[1] + 0x18);
    local_340 = auVar14._0_8_;
    local_240 = local_340;
    uStack_338 = auVar14._8_8_;
    uStack_238 = uStack_338;
    uStack_330 = auVar14._16_8_;
    uStack_230 = uStack_330;
    auVar1 = vsubps_avx(*local_2c0,*local_2c8);
    local_340 = auVar1._0_8_;
    uVar10 = local_340;
    uStack_338 = auVar1._8_8_;
    uVar11 = uStack_338;
    uStack_330 = auVar1._16_8_;
    uVar12 = uStack_330;
    uStack_328 = auVar1._24_8_;
    uVar13 = uStack_328;
    local_1a0 = local_340;
    uStack_198 = uStack_338;
    uStack_190 = uStack_330;
    uStack_188 = uStack_328;
    local_180._0_4_ = auVar1._0_4_;
    local_180._4_4_ = auVar1._4_4_;
    uStack_178._0_4_ = auVar1._8_4_;
    uStack_178._4_4_ = auVar1._12_4_;
    uStack_170._0_4_ = auVar1._16_4_;
    uStack_170._4_4_ = auVar1._20_4_;
    uStack_168._0_4_ = auVar1._24_4_;
    uStack_168._4_4_ = auVar1._28_4_;
    local_340 = CONCAT44(local_180._4_4_ * local_180._4_4_,(float)local_180 * (float)local_180);
    uStack_338._0_4_ = (float)uStack_178 * (float)uStack_178;
    uStack_338._4_4_ = uStack_178._4_4_ * uStack_178._4_4_;
    uStack_330._0_4_ = (float)uStack_170 * (float)uStack_170;
    uStack_330._4_4_ = uStack_170._4_4_ * uStack_170._4_4_;
    auVar14 = _local_340;
    uStack_328._0_4_ = (float)uStack_168 * (float)uStack_168;
    uStack_328._4_4_ = uStack_168._4_4_;
    auVar1 = _local_340;
    local_c0 = local_320;
    uStack_b8 = uStack_318;
    uStack_b0 = uStack_310;
    uStack_a8 = uStack_308;
    local_e0 = local_340;
    uStack_d8 = uStack_338;
    uStack_330 = auVar14._16_8_;
    uStack_d0 = uStack_330;
    uStack_328 = auVar1._24_8_;
    uStack_c8 = uStack_328;
    local_320 = CONCAT44(local_320._4_4_ + local_180._4_4_ * local_180._4_4_,
                         (float)local_80 + (float)local_180 * (float)local_180);
    uStack_318 = CONCAT44(uStack_318._4_4_ + uStack_178._4_4_ * uStack_178._4_4_,
                          (float)uStack_78 + (float)uStack_178 * (float)uStack_178);
    uStack_310 = CONCAT44(uStack_310._4_4_ + uStack_170._4_4_ * uStack_170._4_4_,
                          (float)uStack_70 + (float)uStack_170 * (float)uStack_170);
    uStack_308 = CONCAT44(uStack_308._4_4_ + uStack_168._4_4_,
                          (float)uStack_68 + (float)uStack_168 * (float)uStack_168);
    local_3a8 = local_3a8 + 2;
    local_3b0 = local_3b0 + 2;
    _local_340 = auVar1;
    local_260 = local_360;
    uStack_258 = uStack_358;
    uStack_250 = uStack_350;
    uStack_248 = uStack_348;
    local_180 = uVar10;
    uStack_178 = uVar11;
    uStack_170 = uVar12;
    uStack_168 = uVar13;
    local_140 = uVar2;
    uStack_138 = uVar3;
    uStack_130 = uVar4;
    uStack_128 = uVar5;
    local_80 = uVar6;
    uStack_78 = uVar7;
    uStack_70 = uVar8;
    uStack_68 = uVar9;
  }
  if (7 < local_364) {
    local_2d0 = local_370;
    auVar14 = *(undefined1 (*) [24])*local_370;
    uStack_268 = *(undefined8 *)(*local_370 + 0x18);
    local_2d8 = local_378;
    local_360 = *(undefined8 *)*local_378;
    uStack_358 = *(undefined8 *)(*local_378 + 8);
    uStack_350 = *(undefined8 *)(*local_378 + 0x10);
    uStack_348 = *(undefined8 *)(*local_378 + 0x18);
    local_340 = auVar14._0_8_;
    uStack_338 = auVar14._8_8_;
    uStack_330 = auVar14._16_8_;
    local_280 = local_340;
    uStack_278 = uStack_338;
    uStack_270 = uStack_330;
    auVar1 = vsubps_avx(*local_370,*local_378);
    local_340 = auVar1._0_8_;
    uStack_338 = auVar1._8_8_;
    uStack_330 = auVar1._16_8_;
    uStack_328 = auVar1._24_8_;
    local_1c0 = local_340;
    uVar6 = local_1c0;
    uStack_1b8 = uStack_338;
    uVar7 = uStack_1b8;
    uStack_1b0 = uStack_330;
    uVar8 = uStack_1b0;
    uStack_1a8 = uStack_328;
    uVar9 = uStack_1a8;
    local_1e0 = local_340;
    uStack_1d8 = uStack_338;
    uStack_1d0 = uStack_330;
    uStack_1c8 = uStack_328;
    local_1c0._0_4_ = auVar1._0_4_;
    local_1c0._4_4_ = auVar1._4_4_;
    uStack_1b8._0_4_ = auVar1._8_4_;
    uStack_1b8._4_4_ = auVar1._12_4_;
    uStack_1b0._0_4_ = auVar1._16_4_;
    uStack_1b0._4_4_ = auVar1._20_4_;
    uStack_1a8._0_4_ = auVar1._24_4_;
    uStack_1a8._4_4_ = auVar1._28_4_;
    local_340 = CONCAT44(local_1c0._4_4_ * local_1c0._4_4_,(float)local_1c0 * (float)local_1c0);
    uStack_338._0_4_ = (float)uStack_1b8 * (float)uStack_1b8;
    uStack_338._4_4_ = uStack_1b8._4_4_ * uStack_1b8._4_4_;
    uStack_330._0_4_ = (float)uStack_1b0 * (float)uStack_1b0;
    uStack_330._4_4_ = uStack_1b0._4_4_ * uStack_1b0._4_4_;
    auVar14 = _local_340;
    uStack_328._0_4_ = (float)uStack_1a8 * (float)uStack_1a8;
    uStack_328._4_4_ = uStack_1a8._4_4_;
    auVar1 = _local_340;
    uStack_330 = auVar14._16_8_;
    uStack_328 = auVar1._24_8_;
    local_100 = local_320;
    uStack_f8 = uStack_318;
    uStack_f0 = uStack_310;
    uStack_e8 = uStack_308;
    local_120 = local_340;
    uStack_118 = uStack_338;
    uStack_110 = uStack_330;
    uStack_108 = uStack_328;
    local_320 = CONCAT44(local_320._4_4_ + local_1c0._4_4_ * local_1c0._4_4_,
                         (float)local_80 + (float)local_1c0 * (float)local_1c0);
    uStack_318 = CONCAT44(uStack_318._4_4_ + uStack_1b8._4_4_ * uStack_1b8._4_4_,
                          (float)uStack_78 + (float)uStack_1b8 * (float)uStack_1b8);
    uStack_310 = CONCAT44(uStack_310._4_4_ + uStack_1b0._4_4_ * uStack_1b0._4_4_,
                          (float)uStack_70 + (float)uStack_1b0 * (float)uStack_1b0);
    uStack_308 = CONCAT44(uStack_308._4_4_ + uStack_1a8._4_4_,
                          (float)uStack_68 + (float)uStack_1a8 * (float)uStack_1a8);
    local_364 = local_364 - 8;
    local_370 = local_370 + 1;
    local_378 = local_378 + 1;
    _local_340 = auVar1;
    local_2a0 = local_360;
    uStack_298 = uStack_358;
    uStack_290 = uStack_350;
    uStack_288 = uStack_348;
    local_1c0 = uVar6;
    uStack_1b8 = uVar7;
    uStack_1b0 = uVar8;
    uStack_1a8 = uVar9;
  }
  local_38 = &local_3a0;
  local_60 = local_320;
  uStack_58 = uStack_318;
  uStack_50 = uStack_310;
  uStack_48 = uStack_308;
  local_3a0 = local_320;
  uVar6 = local_3a0;
  uStack_398 = uStack_318;
  uVar7 = uStack_398;
  uStack_390 = uStack_310;
  uVar8 = uStack_390;
  uStack_388 = uStack_308;
  uVar9 = uStack_388;
  uStack_388._4_4_ = (float)((ulong)uStack_308 >> 0x20);
  uStack_388._0_4_ = (float)uStack_308;
  uStack_390._4_4_ = (float)((ulong)uStack_310 >> 0x20);
  uStack_390._0_4_ = (float)uStack_310;
  uStack_398._4_4_ = (float)((ulong)uStack_318 >> 0x20);
  uStack_398._0_4_ = (float)uStack_318;
  local_3a0._4_4_ = (float)((ulong)local_320 >> 0x20);
  local_3a0._0_4_ = (float)local_320;
  local_2f4 = (float)local_3a0 + local_3a0._4_4_ + (float)uStack_398 + uStack_398._4_4_ +
              (float)uStack_390 + uStack_390._4_4_ + (float)uStack_388 + uStack_388._4_4_;
  if (local_364 != 0) {
    local_80 = uVar2;
    uStack_78 = uVar3;
    uStack_70 = uVar4;
    uStack_68 = uVar5;
    local_3a0 = uVar6;
    uStack_398 = uVar7;
    uStack_390 = uVar8;
    uStack_388 = uVar9;
    fVar15 = Sqr_(in_RDI,(float *)local_370,(float *)local_378,local_364);
    local_2f4 = fVar15 + local_2f4;
  }
  return local_2f4;
}

Assistant:

float operator()(const float *p1, const float *p2) const {
    num += 1;
#ifndef __AVX__
    return Sqr_(p1, p2, dim_);
#else
    float result = 0;

    __m256 sum;
    __m256 tmp0, tmp1;
    unsigned residual_size = dim_ % 16;
    unsigned aligned_size = dim_ - residual_size;
    const float *residual_start1 = p1 + aligned_size;
    const float *residual_start2 = p2 + aligned_size;
    float unpack[8] __attribute__((aligned(32))) = {0, 0, 0, 0, 0, 0, 0, 0};

    sum = _mm256_loadu_ps(unpack);

    const float *ptr1 = p1;
    const float *ptr2 = p2;
    for (unsigned i = 0; i < aligned_size; i += 16, ptr1 += 16, ptr2 += 16) {
      AVX_L2SQR(ptr1, ptr2, sum, tmp0, tmp1);
      AVX_L2SQR(ptr1 + 8, ptr2 + 8, sum, tmp0, tmp1);
    }
    if (residual_size >= 8) {
      AVX_L2SQR(residual_start1, residual_start2, sum, tmp0, tmp1);
      residual_size -= 8;
      residual_start1 += 8;
      residual_start2 += 8;
    }
    _mm256_storeu_ps(unpack, sum);
    result = unpack[0] + unpack[1] + unpack[2] + unpack[3] + unpack[4] + unpack[5] + unpack[6] +
             unpack[7];

    if (residual_size > 0) {
      result += Sqr_(residual_start1, residual_start2, residual_size);
    }
    return result;
#endif
  }

 private:
  float Sqr_(const float *p1, const float *p2, uint32_t size) const {
    // Auto vectorized with -O3 flag
    float sum = 0;
    for (size_t i = 0; i < size; i++) {
      float tmp = p1[i] - p2[i];
      sum += tmp * tmp;
    }
    return sum;
  }